

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O3

void QtDebugUtils::formatQRect<QRect>(QDebug *debug,QRect *rect)

{
  Stream *pSVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<(&debug->stream->ts,(rect->x1).m_i);
  pSVar1 = debug->stream;
  if (pSVar1->space == true) {
    QTextStream::operator<<(&pSVar1->ts,' ');
    pSVar1 = debug->stream;
  }
  QTextStream::operator<<(&pSVar1->ts,',');
  pSVar1 = debug->stream;
  if (pSVar1->space == true) {
    QTextStream::operator<<(&pSVar1->ts,' ');
    pSVar1 = debug->stream;
  }
  QTextStream::operator<<(&pSVar1->ts,(rect->y1).m_i);
  pSVar1 = debug->stream;
  if (pSVar1->space == true) {
    QTextStream::operator<<(&pSVar1->ts,' ');
    pSVar1 = debug->stream;
  }
  QTextStream::operator<<(&pSVar1->ts,' ');
  pSVar1 = debug->stream;
  if (pSVar1->space == true) {
    QTextStream::operator<<(&pSVar1->ts,' ');
    pSVar1 = debug->stream;
  }
  lVar3 = (long)(rect->x2).m_i - (long)(rect->x1).m_i;
  lVar2 = (long)(rect->y2).m_i - (long)(rect->y1).m_i;
  QTextStream::operator<<(&pSVar1->ts,lVar3 + 1);
  pSVar1 = debug->stream;
  if (pSVar1->space == true) {
    QTextStream::operator<<(&pSVar1->ts,' ');
    pSVar1 = debug->stream;
  }
  QTextStream::operator<<(&pSVar1->ts,'x');
  pSVar1 = debug->stream;
  if (pSVar1->space == true) {
    QTextStream::operator<<(&pSVar1->ts,' ');
    pSVar1 = debug->stream;
  }
  QTextStream::operator<<(&pSVar1->ts,lVar2 + 1);
  if (debug->stream->space == true) {
    QTextStream::operator<<(&debug->stream->ts,' ');
  }
  if (0x7ffffffe < lVar2 || 0x7ffffffe < lVar3) {
    pSVar1 = debug->stream;
    QVar4.m_data = &DAT_0000000c;
    QVar4.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<(&pSVar1->ts,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if (debug->stream->space == true) {
      QTextStream::operator<<(&debug->stream->ts,' ');
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void formatQRect(QDebug &debug, const Rect &rect)
{
    debug << rect.x() << ',' << rect.y() << ' ';
    if constexpr (std::is_same_v<Rect, QRect>) {
        // QRect may overflow. Calculate width and height in higher precision.
        const qint64 w = qint64(rect.right()) - rect.left() + 1;
        const qint64 h = qint64(rect.bottom()) - rect.top() + 1;
        debug << w << 'x' << h;

        constexpr qint64 M = (std::numeric_limits<int>::max)();
        if (w > M || h > M)
            debug << " (oversized)";
    } else {
        debug << rect.width() << 'x' << rect.height();
    }
}